

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtSimpleBroadphase.cpp
# Opt level: O3

void __thiscall
cbtSimpleBroadphase::cbtSimpleBroadphase
          (cbtSimpleBroadphase *this,int maxProxies,cbtOverlappingPairCache *overlappingPairCache)

{
  undefined8 uVar1;
  undefined8 uVar2;
  cbtHashedOverlappingPairCache *this_00;
  cbtSimpleBroadphaseProxy *pcVar3;
  ulong uVar4;
  cbtSimpleBroadphaseProxy *pcVar5;
  size_t size;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 in_ZMM6 [64];
  
  (this->super_cbtBroadphaseInterface)._vptr_cbtBroadphaseInterface =
       (_func_int **)&PTR__cbtSimpleBroadphase_00b473c8;
  this->m_pairCache = overlappingPairCache;
  this->m_ownsPairCache = false;
  this->m_invalidPair = 0;
  if (overlappingPairCache == (cbtOverlappingPairCache *)0x0) {
    this_00 = (cbtHashedOverlappingPairCache *)cbtAlignedAllocInternal(0x78,0x10);
    cbtHashedOverlappingPairCache::cbtHashedOverlappingPairCache(this_00);
    this->m_pairCache = (cbtOverlappingPairCache *)this_00;
    this->m_ownsPairCache = true;
  }
  size = (long)maxProxies * 0x38;
  pcVar3 = (cbtSimpleBroadphaseProxy *)cbtAlignedAllocInternal(size,0x10);
  this->m_pHandlesRawPtr = pcVar3;
  if (maxProxies == 0) {
    this->m_pHandles = pcVar3;
    this->m_maxHandles = 0;
    this->m_numHandles = 0;
    this->m_firstFreeHandle = 0;
    this->m_LastHandleIndex = -1;
  }
  else {
    auVar8 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar6 = vpmovsxwd_avx2(_DAT_009ebc80);
    auVar9 = vpbroadcastq_avx512f();
    uVar4 = 0;
    pcVar5 = pcVar3;
    do {
      auVar10 = vpbroadcastq_avx512f();
      uVar4 = uVar4 + 8;
      auVar10 = vporq_avx512f(auVar10,auVar8);
      uVar1 = vpcmpuq_avx512f(auVar10,auVar9,2);
      vpscatterdq_avx512f(ZEXT864(pcVar5) + ZEXT3264(auVar6),uVar1,ZEXT1664((undefined1  [16])0x0));
      pcVar5 = pcVar5 + 8;
    } while (((size - 0x38) / 0x38 + 8 & 0xfffffffffffffff8) != uVar4);
    this->m_pHandles = pcVar3;
    this->m_maxHandles = maxProxies;
    this->m_numHandles = 0;
    this->m_firstFreeHandle = 0;
    this->m_LastHandleIndex = -1;
    if (0 < maxProxies) {
      auVar8 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar9 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar10 = vpmovsxbd_avx512f(_DAT_00984100);
      auVar11 = vpbroadcastq_avx512f(ZEXT816(0x38));
      auVar12 = vpbroadcastq_avx512f(ZEXT816(0x10));
      auVar13 = vpbroadcastd_avx512f(ZEXT416(2));
      auVar14 = vpbroadcastd_avx512f(ZEXT416(0x10));
      auVar15 = vpbroadcastq_avx512f();
      auVar16 = vpternlogd_avx512f(in_ZMM6,in_ZMM6,in_ZMM6,0xff);
      uVar4 = (ulong)(maxProxies + 0xfU & 0xfffffff0);
      auVar17 = vpbroadcastq_avx512f();
      do {
        auVar6 = vpmovqd_avx512f(auVar9);
        auVar7 = vpmovqd_avx512f(auVar8);
        auVar18 = vpmullq_avx512dq(auVar9,auVar11);
        auVar19 = vpmullq_avx512dq(auVar8,auVar11);
        uVar1 = vpcmpuq_avx512f(auVar9,auVar17,2);
        uVar2 = vpcmpuq_avx512f(auVar8,auVar17,2);
        auVar9 = vpaddq_avx512f(auVar9,auVar12);
        auVar8 = vpaddq_avx512f(auVar8,auVar12);
        uVar4 = uVar4 - 0x10;
        auVar18 = vpaddq_avx512f(auVar15,auVar18);
        auVar19 = vpaddq_avx512f(auVar15,auVar19);
        auVar20 = vinserti64x4_avx512f(ZEXT3264(auVar6),auVar7,1);
        auVar20 = vpsubd_avx512f(auVar20,auVar16);
        vpscatterqd_avx512f(ZEXT832(0x34) + auVar18._0_32_,uVar1,auVar20._0_32_);
        auVar6 = vextracti64x4_avx512f(auVar20,1);
        vpscatterqd_avx512f(ZEXT832(0x34) + auVar19._0_32_,uVar2,auVar6);
        auVar20 = vpaddd_avx512f(auVar10,auVar13);
        auVar10 = vpaddd_avx512f(auVar10,auVar14);
        vpscatterqd_avx512f(ZEXT832(0x10) + auVar18._0_32_,uVar1,auVar20._0_32_);
        auVar6 = vextracti64x4_avx512f(auVar20,1);
        vpscatterqd_avx512f(ZEXT832(0x10) + auVar19._0_32_,uVar2,auVar6);
      } while (uVar4 != 0);
    }
  }
  *(undefined4 *)&pcVar3[(long)maxProxies + -1].super_cbtBroadphaseProxy.field_0x34 = 0;
  return;
}

Assistant:

cbtSimpleBroadphase::cbtSimpleBroadphase(int maxProxies, cbtOverlappingPairCache* overlappingPairCache)
	: m_pairCache(overlappingPairCache),
	  m_ownsPairCache(false),
	  m_invalidPair(0)
{
	if (!overlappingPairCache)
	{
		void* mem = cbtAlignedAlloc(sizeof(cbtHashedOverlappingPairCache), 16);
		m_pairCache = new (mem) cbtHashedOverlappingPairCache();
		m_ownsPairCache = true;
	}

	// allocate handles buffer and put all handles on free list
	m_pHandlesRawPtr = cbtAlignedAlloc(sizeof(cbtSimpleBroadphaseProxy) * maxProxies, 16);
	m_pHandles = new (m_pHandlesRawPtr) cbtSimpleBroadphaseProxy[maxProxies];
	m_maxHandles = maxProxies;
	m_numHandles = 0;
	m_firstFreeHandle = 0;
	m_LastHandleIndex = -1;

	{
		for (int i = m_firstFreeHandle; i < maxProxies; i++)
		{
			m_pHandles[i].SetNextFree(i + 1);
			m_pHandles[i].m_uniqueId = i + 2;  //any UID will do, we just avoid too trivial values (0,1) for debugging purposes
		}
		m_pHandles[maxProxies - 1].SetNextFree(0);
	}
}